

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O2

int stlstp_(double *y,int *n,int *np,int *ns,int *nt,int *nl,int *isdeg,int *itdeg,int *ildeg,
           int *nsjump,int *ntjump,int *nljump,int *ni,int *userw,double *rw,double *season,
           double *trend,double *work)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int local_5c;
  int local_58;
  int c_false;
  int *local_50;
  double *local_48;
  uint local_3c;
  uint *local_38;
  
  local_5c = 0;
  uVar2 = *np * 2 + *n;
  lVar5 = (long)(int)uVar2;
  iVar6 = *ni;
  if (*ni < 1) {
    iVar6 = 0;
  }
  lVar3 = (long)(int)~uVar2;
  local_48 = work + lVar3 + (long)(int)(uVar2 * 3) + 1;
  c_false = iVar6 + 1;
  local_50 = np;
  local_38 = (uint *)n;
  for (local_58 = 1; local_58 != c_false; local_58 = local_58 + 1) {
    uVar1 = (ulong)*local_38;
    if ((int)*local_38 < 1) {
      uVar1 = 0;
    }
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      work[lVar3 + lVar5 + uVar4 + 1] = y[uVar4] - trend[uVar4];
    }
    stlss_(work,(int *)local_38,local_50,ns,isdeg,nsjump,userw,rw,
           work + lVar3 + (int)(uVar2 * 2 + 1),local_48,work + lVar3 + (int)(uVar2 * 4 + 1),
           work + lVar3 + (long)(int)(uVar2 * 5) + 1,season);
    local_3c = *local_50 * 2 + *local_38;
    stlfts_(work + lVar3 + (int)(uVar2 * 2 + 1),(int *)&local_3c,local_50,local_48,work);
    stless_(local_48,(int *)local_38,nl,ildeg,nljump,&local_5c,work + lVar3 + (int)(uVar2 * 4 + 1),
            work,work + lVar3 + (long)(int)(uVar2 * 5) + 1);
    local_3c = *local_38;
    uVar1 = 0;
    if (0 < (int)local_3c) {
      uVar1 = (ulong)local_3c;
    }
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      season[uVar4] =
           work[lVar3 + (int)(uVar2 * 2 + 1 + (int)uVar4 + *local_50)] -
           work[lVar3 + lVar5 + uVar4 + 1];
    }
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      work[lVar3 + lVar5 + uVar4 + 1] = y[uVar4] - season[uVar4];
    }
    stless_(work,(int *)local_38,nt,itdeg,ntjump,userw,rw,trend,local_48);
  }
  return 0;
}

Assistant:

int stlstp_(double *y, int *n, int *np, int *ns, int *nt, int *nl, int *isdeg, int *itdeg, int 
	*ildeg, int *nsjump, int *ntjump, int *nljump, int *ni, int *userw, double *rw, double *season,
	double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;

    /* Local variables */
    int i__, j;
	int c_false = 0;

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    i__1 = *ni;
    for (j = 1; j <= i__1; ++j) {
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - trend[i__];
/* L1: */
	}
	stlss_(&work[work_dim1 + 1], n, np, ns, isdeg, nsjump, userw, &rw[1], 
		&work[(work_dim1 << 1) + 1], &work[work_dim1 * 3 + 1], &work[(
		work_dim1 << 2) + 1], &work[work_dim1 * 5 + 1], &season[1]);
	i__2 = *n + (*np << 1);
	stlfts_(&work[(work_dim1 << 1) + 1], &i__2, np, &work[work_dim1 * 3 + 
		1], &work[work_dim1 + 1]);
	stless_(&work[work_dim1 * 3 + 1], n, nl, ildeg, nljump, &c_false, &
		work[(work_dim1 << 2) + 1], &work[work_dim1 + 1], &work[
		work_dim1 * 5 + 1]);
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    season[i__] = work[*np + i__ + (work_dim1 << 1)] - work[i__ + 
		    work_dim1];
/* L3: */
	}
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work[i__ + work_dim1] = y[i__] - season[i__];
/* L5: */
	}
	stless_(&work[work_dim1 + 1], n, nt, itdeg, ntjump, userw, &rw[1], &
		trend[1], &work[work_dim1 * 3 + 1]);
/* L80: */
    }
    return 0;
}